

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-aligned.c
# Opt level: O0

void * mi_heap_malloc_zero_aligned_at
                 (mi_heap_t *heap,size_t size,size_t alignment,size_t offset,_Bool zero)

{
  _Bool _Var1;
  void *pvVar2;
  long in_RCX;
  uintptr_t in_RDX;
  ulong in_RSI;
  byte in_R8B;
  void *p;
  _Bool is_aligned;
  mi_page_t *page;
  size_t padsize;
  uintptr_t align_mask;
  mi_page_t *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 uVar3;
  byte bVar4;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 zero_00;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  mi_page_t *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  mi_heap_t *in_stack_ffffffffffffffc8;
  void *local_8;
  
  zero_00 = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  bVar4 = 1;
  if (in_RDX != 0) {
    _Var1 = _mi_is_power_of_two(in_RDX);
    bVar4 = _Var1 ^ 0xff;
  }
  if ((bVar4 & 1) == 0) {
    uVar3 = in_RSI < 0x401 && in_RDX <= in_RSI;
    if (in_RSI < 0x401 && in_RDX <= in_RSI) {
      in_stack_ffffffffffffffc8 = (mi_heap_t *)(in_RDX - 1);
      in_stack_ffffffffffffffb8 =
           _mi_heap_get_free_small_page
                     ((mi_heap_t *)CONCAT17(bVar4,CONCAT16(uVar3,in_stack_ffffffffffffffa0)),
                      (size_t)in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffc0 = in_RSI;
      if ((in_stack_ffffffffffffffb8->free != (mi_block_t *)0x0) &&
         (in_stack_ffffffffffffffb7 =
               ((long)&in_stack_ffffffffffffffb8->free->next + in_RCX &
               (ulong)in_stack_ffffffffffffffc8) == 0, (bool)in_stack_ffffffffffffffb7)) {
        if ((in_R8B & 1) != 0) {
          pvVar2 = _mi_page_malloc_zeroed
                             ((mi_heap_t *)CONCAT17(bVar4,CONCAT16(uVar3,in_stack_ffffffffffffffa0))
                              ,in_stack_ffffffffffffff98,0xab67df);
          return pvVar2;
        }
        pvVar2 = _mi_page_malloc((mi_heap_t *)
                                 CONCAT17(bVar4,CONCAT16(uVar3,in_stack_ffffffffffffffa0)),
                                 in_stack_ffffffffffffff98,0xab67f9);
        return pvVar2;
      }
    }
    local_8 = mi_heap_malloc_zero_aligned_at_generic
                        (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                         (size_t)in_stack_ffffffffffffffb8,
                         CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                         (_Bool)zero_00);
  }
  else {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

static void* mi_heap_malloc_zero_aligned_at(mi_heap_t* const heap, const size_t size, const size_t alignment, const size_t offset, const bool zero) mi_attr_noexcept
{
  // note: we don't require `size > offset`, we just guarantee that the address at offset is aligned regardless of the allocated size.
  if mi_unlikely(alignment == 0 || !_mi_is_power_of_two(alignment)) { // require power-of-two (see <https://en.cppreference.com/w/c/memory/aligned_alloc>)
    #if MI_DEBUG > 0
    _mi_error_message(EOVERFLOW, "aligned allocation requires the alignment to be a power-of-two (size %zu, alignment %zu)\n", size, alignment);
    #endif
    return NULL;
  }

  #if MI_GUARDED
  if (offset==0 && alignment < MI_BLOCK_ALIGNMENT_MAX && mi_heap_malloc_use_guarded(heap,size)) {
    return mi_heap_malloc_guarded_aligned(heap, size, alignment, zero);
  }
  #endif

  // try first if there happens to be a small block available with just the right alignment
  if mi_likely(size <= MI_SMALL_SIZE_MAX && alignment <= size) {
    const uintptr_t align_mask = alignment-1;       // for any x, `(x & align_mask) == (x % alignment)`
    const size_t padsize = size + MI_PADDING_SIZE;
    mi_page_t* page = _mi_heap_get_free_small_page(heap, padsize);
    if mi_likely(page->free != NULL) {
      const bool is_aligned = (((uintptr_t)page->free + offset) & align_mask)==0;
      if mi_likely(is_aligned)
      {
        void* p = (zero ? _mi_page_malloc_zeroed(heap,page,padsize) : _mi_page_malloc(heap,page,padsize)); // call specific page malloc for better codegen
        mi_assert_internal(p != NULL);
        mi_assert_internal(((uintptr_t)p + offset) % alignment == 0);
        mi_track_malloc(p,size,zero);
        return p;
      }
    }